

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

unique_pointer<const_void> __thiscall
pstore::database::get_spanningu(database *this,address addr,size_t size,bool initialized)

{
  element_type *peVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> __dest;
  undefined7 in_register_00000009;
  _Head_base<0UL,_const_void_*,_false> extraout_RDX;
  char *str;
  void *__src;
  void *pvVar6;
  int in_R8D;
  uint uVar7;
  ulong uVar8;
  sat_entry *this_00;
  ulong uVar9;
  ulong uVar10;
  pointer __p;
  unique_pointer<const_void> uVar11;
  unique_pointer<std::uint8_t> result;
  int local_54;
  unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)> local_40;
  
  uVar10 = CONCAT71(in_register_00000009,initialized);
  __dest._M_head_impl = (array<pstore::sat_entry,_65536UL> *)operator_new__(uVar10);
  local_40._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(unsigned_char_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(unsigned_char_*)>.
  super__Tuple_impl<1UL,_void_(*)(unsigned_char_*)>.
  super__Head_base<1UL,_void_(*)(unsigned_char_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(unsigned_char_*),_false>)deleter<unsigned_char>;
  if (in_R8D == 0) {
LAB_0011bb18:
    local_40._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(unsigned_char_*)>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(unsigned_char_*)>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    this->_vptr_database = (_func_int **)deleter<void_const>;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         __dest._M_head_impl;
    std::unique_ptr<unsigned_char,_void_(*)(unsigned_char_*)>::~unique_ptr(&local_40);
    uVar11._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
    super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
    super__Head_base<0UL,_const_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
    uVar11._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
    super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
    super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
    super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(const_void_*),_false>)
         (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
    return (unique_pointer<const_void>)
           uVar11._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
           super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
  }
  uVar8 = size >> 0x16;
  uVar9 = (ulong)(((uint)uVar8 & 0xffff) << 5);
  local_54 = 0x140;
  str = 
  "segment_pointer.value != nullptr && segment_pointer.region != nullptr && segment_pointer.is_valid ()"
  ;
  local_40._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(unsigned_char_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(unsigned_char_*)>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)__dest._M_head_impl;
  if ((*(long *)(*(long *)(addr.a_ + 8) + uVar9) != 0) &&
     (this_00 = (sat_entry *)(*(long *)(addr.a_ + 8) + uVar9),
     (this_00->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr != (element_type *)0x0)) {
    bVar5 = sat_entry::is_valid(this_00);
    if (bVar5) {
      __src = (void *)((ulong)((uint)size & 0x3fffff) +
                      (long)(this_00->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      peVar1 = (this_00->region).
               super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pvVar6 = (peVar1->ptr_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_54 = 0x148;
      str = 
      "in_store_ptr >= region_base && in_store_ptr <= region_base + segment_pointer.region->size ()"
      ;
      if ((pvVar6 <= __src) && (uVar2 = peVar1->size_, __src <= (void *)(uVar2 + (long)pvVar6))) {
        uVar9 = (long)pvVar6 + (uVar2 - (long)__src);
        if (uVar10 <= uVar9) {
          uVar9 = uVar10;
        }
        memcpy(__dest._M_head_impl,__src,uVar9);
        pvVar6 = (void *)((long)(__dest._M_head_impl)->_M_elems + uVar9);
        lVar3 = *(long *)(addr.a_ + 8);
        for (uVar10 = uVar10 - uVar9; uVar10 != 0; uVar10 = uVar10 - uVar9) {
          uVar9 = uVar9 + 0x3fffff >> 0x16;
          if (0xfffe < uVar9) {
            local_54 = 0x15c;
            str = "inc < std::numeric_limits<address::segment_type>::max ()";
            goto LAB_0011bb7d;
          }
          if (0xffff < (uVar8 & 0xffff) + uVar9) {
            local_54 = 0x15d;
            str = "segment + inc < sat_elements";
            goto LAB_0011bb7d;
          }
          uVar7 = (int)uVar8 + (int)uVar9;
          uVar8 = (ulong)uVar7;
          lVar4 = *(long *)(lVar3 + 0x10 + (ulong)((uVar7 & 0xffff) << 5));
          if (lVar4 == 0) {
            local_54 = 0x161;
            str = "region != nullptr";
            goto LAB_0011bb7d;
          }
          uVar9 = *(ulong *)(lVar4 + 0x28);
          if (uVar10 <= *(ulong *)(lVar4 + 0x28)) {
            uVar9 = uVar10;
          }
          memcpy(pvVar6,*(void **)(lVar4 + 8),uVar9);
          pvVar6 = (void *)((long)pvVar6 + uVar9);
        }
        goto LAB_0011bb18;
      }
    }
  }
LAB_0011bb7d:
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,local_54);
}

Assistant:

auto database::get_spanningu (address const addr, std::size_t const size,
                                  bool const initialized) const -> unique_pointer<void const> {
        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        unique_pointer<std::uint8_t> result{new std::uint8_t[size], deleter};
        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return {result.release (), deleter};
    }